

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

void __thiscall
testing::internal::UntypedFunctionMockerBase::UninterestingCallCleanupHandler::
~UninterestingCallCleanupHandler(UninterestingCallCleanupHandler *this)

{
  CallReaction reaction;
  string local_30;
  UninterestingCallCleanupHandler *local_10;
  UninterestingCallCleanupHandler *this_local;
  
  reaction = this->reaction;
  local_10 = this;
  std::__cxx11::stringstream::str();
  ReportUninterestingCall(reaction,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

~UninterestingCallCleanupHandler() {
    ReportUninterestingCall(reaction, ss.str());
  }